

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButtonPrivate::click(QAbstractButtonPrivate *this)

{
  long lVar1;
  byte bVar2;
  QAbstractButton *pQVar3;
  QAbstractButton *pQVar4;
  QButtonGroupPrivate *pQVar5;
  QAbstractButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool changeState;
  QAbstractButton *q;
  QPointer<QAbstractButton> guard;
  QWidget *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  QAbstractButtonPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  in_RDI->field_0x28c = in_RDI->field_0x28c & 0xef;
  in_RDI->field_0x28c = in_RDI->field_0x28c & 0xdf | 0x20;
  bVar6 = true;
  if ((((byte)in_RDI->field_0x28c >> 1 & 1) != 0) &&
     (pQVar4 = queryCheckedButton(in_stack_ffffffffffffffe8), pQVar4 == pQVar3)) {
    if (in_RDI->group == (QButtonGroup *)0x0) {
      bVar2 = (byte)in_RDI->field_0x28c >> 3;
    }
    else {
      pQVar5 = QButtonGroup::d_func((QButtonGroup *)0x4ff2a3);
      bVar2 = pQVar5->exclusive;
    }
    in_stack_ffffffffffffffc4 = (uint)(bVar2 & 1);
    bVar6 = in_stack_ffffffffffffffc4 == 0;
  }
  QPointer<QAbstractButton>::QPointer<void>
            ((QPointer<QAbstractButton> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (QAbstractButton *)in_stack_ffffffffffffffb8);
  if (bVar6) {
    (**(code **)(*(long *)&pQVar3->super_QWidget + 0x1b0))();
    bVar6 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff321);
    if (!bVar6) goto LAB_004ff391;
  }
  in_RDI->field_0x28c = in_RDI->field_0x28c & 0xdf;
  refresh((QAbstractButtonPrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QWidget::repaint(in_stack_ffffffffffffffb8);
  bVar6 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff35f);
  if (bVar6) {
    emitReleased(in_RDI);
  }
  bVar6 = ::QPointer::operator_cast_to_bool((QPointer<QAbstractButton> *)0x4ff379);
  if (bVar6) {
    emitClicked(in_RDI);
  }
LAB_004ff391:
  QPointer<QAbstractButton>::~QPointer((QPointer<QAbstractButton> *)0x4ff39b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButtonPrivate::click()
{
    Q_Q(QAbstractButton);

    down = false;
    blockRefresh = true;
    bool changeState = true;
    if (checked && queryCheckedButton() == q) {
        // the checked button of an exclusive or autoexclusive group cannot be unchecked
#if QT_CONFIG(buttongroup)
        if (group ? group->d_func()->exclusive : autoExclusive)
#else
        if (autoExclusive)
#endif
            changeState = false;
    }

    QPointer<QAbstractButton> guard(q);
    if (changeState) {
        q->nextCheckState();
        if (!guard)
            return;
    }
    blockRefresh = false;
    refresh();
    q->repaint();
    if (guard)
        emitReleased();
    if (guard)
        emitClicked();
}